

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O3

SynNew * ParseNew(ParseContext *ctx)

{
  Lexeme *begin;
  SynBase *pSVar1;
  int iVar2;
  SynBase *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Lexeme *pLVar3;
  SynBase *this_00;
  undefined4 extraout_var_01;
  SynNew *pSVar4;
  undefined4 extraout_var_03;
  LexemeType LVar5;
  SynBase *pSVar6;
  IntrusiveList<SynBase> IVar7;
  IntrusiveList<SynCallArgument> local_40;
  undefined4 extraout_var_02;
  
  begin = ctx->currentLexeme;
  if (begin->type != lex_new) {
    return (SynNew *)0x0;
  }
  ctx->currentLexeme = begin + 1;
  if (begin[1].type == lex_oparen) {
    ctx->currentLexeme = begin + 2;
    this = ParseType(ctx,(bool *)0x0,false);
    if (this == (SynBase *)0x0) {
      anon_unknown.dwarf_15b62::Report
                (ctx,ctx->currentLexeme,"ERROR: type name expected after \'new\'");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
      this = (SynBase *)CONCAT44(extraout_var,iVar2);
      SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
      this->_vptr_SynBase = (_func_int **)&PTR__SynBase_00222408;
    }
    anon_unknown.dwarf_15b62::CheckConsume
              (ctx,lex_cparen,"ERROR: matching \')\' not found after \'(\'");
    pLVar3 = ctx->currentLexeme;
    LVar5 = pLVar3->type;
    if (LVar5 != lex_obracket) goto LAB_00112ffe;
LAB_00112ef8:
    ctx->currentLexeme = pLVar3 + 1;
    this_00 = ParseTernaryExpr(ctx);
    if (this_00 == (SynBase *)0x0) {
      anon_unknown.dwarf_15b62::Report
                (ctx,ctx->currentLexeme,"ERROR: expression not found after \'[\'");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
      this_00 = (SynBase *)CONCAT44(extraout_var_01,iVar2);
      SynBase::SynBase(this_00,0,ctx->currentLexeme,ctx->currentLexeme);
      this_00->_vptr_SynBase = (_func_int **)&PTR__SynBase_00222408;
    }
    anon_unknown.dwarf_15b62::CheckConsume
              (ctx,lex_cbracket,"ERROR: \']\' not found after expression");
  }
  else {
    this = ParseType(ctx,(bool *)0x0,true);
    if (this == (SynBase *)0x0) {
      anon_unknown.dwarf_15b62::Report
                (ctx,ctx->currentLexeme,"ERROR: type name expected after \'new\'");
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])();
      this = (SynBase *)CONCAT44(extraout_var_00,iVar2);
      SynBase::SynBase(this,0,ctx->currentLexeme,ctx->currentLexeme);
      this->_vptr_SynBase = (_func_int **)&PTR__SynBase_00222408;
    }
    pLVar3 = ctx->currentLexeme;
    LVar5 = pLVar3->type;
    if (LVar5 == lex_obracket) goto LAB_00112ef8;
    if (this->typeID != 9) {
LAB_00112ffe:
      if (LVar5 == lex_oparen) {
        ctx->currentLexeme = pLVar3 + 1;
        local_40 = ParseCallArguments(ctx);
        anon_unknown.dwarf_15b62::CheckConsume
                  (ctx,lex_cparen,"ERROR: \')\' not found after function argument list");
        pLVar3 = ctx->currentLexeme;
        LVar5 = pLVar3->type;
      }
      else {
        local_40 = (IntrusiveList<SynCallArgument>)ZEXT816(0);
      }
      if (LVar5 == lex_ofigure) {
        ctx->currentLexeme = pLVar3 + 1;
        IVar7 = ParseExpressions(ctx);
        anon_unknown.dwarf_15b62::CheckConsume
                  (ctx,lex_cfigure,"ERROR: \'}\' not found after custom constructor body");
      }
      else {
        IVar7 = (IntrusiveList<SynBase>)ZEXT816(0);
      }
      iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x70);
      pSVar4 = (SynNew *)CONCAT44(extraout_var_03,iVar2);
      if (ctx->firstLexeme < ctx->currentLexeme) {
        SynBase::SynBase((SynBase *)pSVar4,0x20,begin,ctx->currentLexeme + -1);
        (pSVar4->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002226e0;
        pSVar4->type = this;
        (pSVar4->arguments).head = local_40.head;
        (pSVar4->arguments).tail = local_40.tail;
        pSVar4->count = (SynBase *)0x0;
        pSVar4->constructor = IVar7;
        return pSVar4;
      }
      goto LAB_00113126;
    }
    pSVar1 = *(SynBase **)&this[1].typeID;
    this_00 = (SynBase *)0x0;
    do {
      pSVar6 = this_00;
      this_00 = pSVar1;
      pSVar1 = this_00->next;
    } while (this_00->next != (SynBase *)0x0);
    if (this_00->typeID == 3) goto LAB_00112ffe;
    if (pSVar6 == (SynBase *)0x0) {
      this = (SynBase *)this[1]._vptr_SynBase;
    }
    else {
      pSVar6->next = (SynBase *)0x0;
    }
  }
  iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x70);
  pSVar4 = (SynNew *)CONCAT44(extraout_var_02,iVar2);
  if (ctx->firstLexeme < ctx->currentLexeme) {
    SynBase::SynBase((SynBase *)pSVar4,0x20,begin,ctx->currentLexeme + -1);
    (pSVar4->super_SynBase)._vptr_SynBase = (_func_int **)&PTR__SynBase_002226e0;
    pSVar4->type = this;
    (pSVar4->arguments).head = (SynCallArgument *)0x0;
    (pSVar4->arguments).tail = (SynCallArgument *)0x0;
    pSVar4->count = this_00;
    (pSVar4->constructor).head = (SynBase *)0x0;
    (pSVar4->constructor).tail = (SynBase *)0x0;
    return pSVar4;
  }
LAB_00113126:
  __assert_fail("currentLexeme > firstLexeme",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ParseTree.cpp"
                ,0x19c,"Lexeme *ParseContext::Previous()");
}

Assistant:

SynNew* ParseNew(ParseContext &ctx)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.Consume(lex_new))
	{
		SynBase *type = NULL;

		bool explicitType = ctx.Consume(lex_oparen);

		if(explicitType)
		{
			type = ParseType(ctx);

			if(!type)
			{
				Report(ctx, ctx.Current(), "ERROR: type name expected after 'new'");

				type = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			CheckConsume(ctx, lex_cparen, "ERROR: matching ')' not found after '('");
		}
		else
		{
			type = ParseType(ctx, NULL, true);

			if(!type)
			{
				Report(ctx, ctx.Current(), "ERROR: type name expected after 'new'");

				type = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}
		}

		IntrusiveList<SynCallArgument> arguments;

		IntrusiveList<SynBase> constructor;

		if(ctx.Consume(lex_obracket))
		{
			SynBase *count = ParseTernaryExpr(ctx);

			if(!count)
			{
				Report(ctx, ctx.Current(), "ERROR: expression not found after '['");

				count = new (ctx.get<SynError>()) SynError(ctx.Current(), ctx.Current());
			}

			CheckConsume(ctx, lex_cbracket, "ERROR: ']' not found after expression");

			return new (ctx.get<SynNew>()) SynNew(start, ctx.Previous(), type, arguments, count, constructor);
		}
		else if(!explicitType && isType<SynTypeArray>(type))
		{
			SynTypeArray *arrayType = getType<SynTypeArray>(type);

			// Try to extract last array type extent as a size
			SynBase *prevSize = NULL;
			SynBase *count = arrayType->sizes.head;

			while(count->next)
			{
				prevSize = count;
				count = count->next;
			}

			// Check if the extent is real
			if(!isType<SynNothing>(count))
			{
				if(prevSize)
					prevSize->next = NULL;
				else
					type = arrayType->type;

				return new (ctx.get<SynNew>()) SynNew(start, ctx.Previous(), type, arguments, count, constructor);
			}
		}

		if(ctx.Consume(lex_oparen))
		{
			arguments = ParseCallArguments(ctx);

			CheckConsume(ctx, lex_cparen, "ERROR: ')' not found after function argument list");
		}

		if(ctx.Consume(lex_ofigure))
		{
			constructor = ParseExpressions(ctx);

			CheckConsume(ctx, lex_cfigure, "ERROR: '}' not found after custom constructor body");
		}

		return new (ctx.get<SynNew>()) SynNew(start, ctx.Previous(), type, arguments, NULL, constructor);
	}

	return NULL;
}